

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O0

void __thiscall
delta_complex_t::if_common_create_all
          (delta_complex_t *this,size_t start,size_t end,int dim,char *filter,size_t thread,
          vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
          *new_cells,
          vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
          *new_cliques,
          vector<std::vector<std::tuple<long,_long,_long>,_std::allocator<std::tuple<long,_long,_long>_>_>,_std::allocator<std::vector<std::tuple<long,_long,_long>,_std::allocator<std::tuple<long,_long,_long>_>_>_>_>
          *new_clique_cofaces,
          vector<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::allocator<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>
          *new_cell_cofaces)

{
  bool bVar1;
  reference this_00;
  reference this_01;
  reference pvVar2;
  size_type *psVar3;
  reference pvVar4;
  reference plVar5;
  long v;
  iterator __end2;
  iterator __begin2;
  set<long,_std::less<long>,_std::allocator<long>_> *__range2;
  int c;
  size_t thread_local;
  char *filter_local;
  int dim_local;
  size_t end_local;
  size_t start_local;
  delta_complex_t *this_local;
  
  for (__range2._4_4_ = (int)start; (ulong)(long)__range2._4_4_ < end;
      __range2._4_4_ = __range2._4_4_ + 1) {
    this_00 = std::
              vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
              ::operator[](&this->cells,0);
    this_01 = std::
              vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
              ::operator[](&this->cliques,(long)(dim + -1));
    pvVar2 = std::vector<clique_t,_std::allocator<clique_t>_>::operator[]
                       (this_01,(long)__range2._4_4_);
    psVar3 = (size_type *)std::vector<long,_std::allocator<long>_>::operator[](&pvVar2->vertices,0);
    pvVar4 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::operator[]
                       (this_00,*psVar3);
    __end2 = std::set<long,_std::less<long>,_std::allocator<long>_>::begin(&pvVar4->neighbours);
    v = (long)std::set<long,_std::less<long>,_std::allocator<long>_>::end(&pvVar4->neighbours);
    while( true ) {
      bVar1 = std::operator!=(&__end2,(_Self *)&v);
      if (!bVar1) break;
      plVar5 = std::_Rb_tree_const_iterator<long>::operator*(&__end2);
      if_common_create(this,(long)__range2._4_4_,*plVar5,(long)dim,filter,thread,new_cells,
                       new_cliques,new_clique_cofaces,new_cell_cofaces);
      std::_Rb_tree_const_iterator<long>::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void if_common_create_all(size_t start, size_t end, int dim, const char* filter, size_t thread,
         std::vector<std::vector<delta_complex_cell_t>>& new_cells, std::vector<std::vector<clique_t>>& new_cliques,
        std::vector<std::vector<std::tuple<index_t, index_t, index_t>>>& new_clique_cofaces,std::vector<std::vector<std::pair<index_t, index_t>>>& new_cell_cofaces){
        for(int c = start; c < end; c++){
            for(auto v : cells[0][cliques[dim-1][c].vertices[0]].neighbours){
                if_common_create(c,v,dim,filter,thread,new_cells,new_cliques,new_clique_cofaces,new_cell_cofaces);
            }
        }
    }